

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpStateVarComplete.c
# Opt level: O1

int UpnpStateVarComplete_set_CurrentVal(UpnpStateVarComplete *p,char *s)

{
  char *pcVar1;
  
  pcVar1 = (char *)ixmlCloneDOMString(s);
  if (pcVar1 != (char *)0x0) {
    ixmlFreeDOMString(p->m_CurrentVal);
    p->m_CurrentVal = pcVar1;
  }
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

int UpnpStateVarComplete_set_CurrentVal(
	UpnpStateVarComplete *p, const DOMString s)
{
	DOMString q = ixmlCloneDOMString(s);
	if (!q)
		return 0;
	ixmlFreeDOMString(p->m_CurrentVal);
	p->m_CurrentVal = q;

	return 1;
}